

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestGroupUtil.hpp
# Opt level: O3

TestCaseGroup *
vkt::
createTestGroup<tcu::TestStatus(*)(vkt::Context&,vk::VkFormat,vk::VkImageType,vk::VkImageTiling)>
          (TestContext *testCtx,string *name,string *description,CreateChildrenFunc createChildren,
          _func_TestStatus_Context_ptr_VkFormat_VkImageType_VkImageTiling *arg0)

{
  TestCaseGroup *this;
  
  this = (TestCaseGroup *)operator_new(0x80);
  tcu::TestCaseGroup::TestCaseGroup
            (this,testCtx,(name->_M_dataplus)._M_p,(description->_M_dataplus)._M_p);
  (this->super_TestNode)._vptr_TestNode = (_func_int **)&PTR__TestCase_00cf0228;
  this[1].super_TestNode._vptr_TestNode = (_func_int **)createChildren;
  this[1].super_TestNode.m_testCtx = (TestContext *)arg0;
  return this;
}

Assistant:

tcu::TestCaseGroup* createTestGroup (tcu::TestContext&										testCtx,
									 const std::string&										name,
									 const std::string&										description,
									 typename TestGroupHelper1<Arg0>::CreateChildrenFunc	createChildren,
									 Arg0													arg0)
{
	return new TestGroupHelper1<Arg0>(testCtx, name, description, createChildren, arg0);
}